

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectionManager.cpp
# Opt level: O3

SelectionManager * __thiscall
OpenMD::SelectionManager::removeAtomsInRigidBodies
          (SelectionManager *__return_storage_ptr__,SelectionManager *this)

{
  ulong *puVar1;
  int iVar2;
  _func_int **pp_Var3;
  long lVar4;
  StuntDouble *pSVar5;
  _func_int *p_Var6;
  _func_int **pp_Var7;
  int iVar8;
  int isd;
  SelectionSet ssAtoms;
  int local_5c;
  SelectionSet local_58;
  vector<int,_std::allocator<int>_> local_40;
  
  std::vector<int,_std::allocator<int>_>::vector(&local_40,&this->nObjects_);
  SelectionSet::SelectionSet(&local_58,&local_40);
  if (local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  SelectionSet::clearAll(&local_58);
  SelectionManager(__return_storage_ptr__,this);
  pSVar5 = beginSelected(__return_storage_ptr__,&local_5c);
  if (pSVar5 != (StuntDouble *)0x0) {
    do {
      if (pSVar5->objType_ == otRigidBody) {
        pp_Var7 = (_func_int **)pSVar5[2].mass_;
        pp_Var3 = pSVar5[2].properties_._vptr_PropertyMap;
        if ((pp_Var7 != pp_Var3) && (p_Var6 = *pp_Var7, p_Var6 != (_func_int *)0x0)) {
          lVar4 = (long)((local_58.bitsets_.
                          super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                          ._M_impl.super__Vector_impl_data._M_start)->bitset_).
                        super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                        _M_start.super__Bit_iterator_base._M_p;
          do {
            pp_Var7 = pp_Var7 + 1;
            iVar2 = *(int *)(p_Var6 + 0x28);
            iVar8 = iVar2 + 0x3f;
            if (-1 < (long)iVar2) {
              iVar8 = iVar2;
            }
            puVar1 = (ulong *)(lVar4 + (long)(iVar8 >> 6) * 8 + -8 +
                              (ulong)(((long)iVar2 & 0x800000000000003fU) < 0x8000000000000001) * 8)
            ;
            *puVar1 = *puVar1 | 1L << ((byte)iVar2 & 0x3f);
          } while ((pp_Var7 != pp_Var3) && (p_Var6 = *pp_Var7, p_Var6 != (_func_int *)0x0));
        }
      }
      pSVar5 = nextSelected(__return_storage_ptr__,&local_5c);
    } while (pSVar5 != (StuntDouble *)0x0);
  }
  SelectionSet::operator-=(&__return_storage_ptr__->ss_,&local_58);
  std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
            (&local_58.bitsets_);
  return __return_storage_ptr__;
}

Assistant:

SelectionManager SelectionManager::removeAtomsInRigidBodies() const {
    SelectionSet ssAtoms(nObjects_);
    ssAtoms.clearAll();

    SelectionManager tempSeleMan = *this;

    StuntDouble* sd;
    int isd;
    std::vector<Atom*>::iterator ai;
    Atom* atom;
    for (sd = tempSeleMan.beginSelected(isd); sd != NULL;
         sd = tempSeleMan.nextSelected(isd)) {
      if (sd->isRigidBody()) {
        RigidBody* rb = static_cast<RigidBody*>(sd);
        for (atom = rb->beginAtom(ai); atom != NULL; atom = rb->nextAtom(ai)) {
          ssAtoms.bitsets_[STUNTDOUBLE].setBitOn(atom->getGlobalIndex());
        }
      }
    }

    // Remove the atoms in rigid bodies from our selection set.
    tempSeleMan.ss_ -= ssAtoms;

    return tempSeleMan;
  }